

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O1

unsigned_long __thiscall
cmELFInternalImpl<cmELFTypes64>::GetDynamicEntryPosition
          (cmELFInternalImpl<cmELFTypes64> *this,int j)

{
  int iVar1;
  pointer paVar2;
  bool bVar3;
  unsigned_long uVar4;
  
  bVar3 = LoadDynamicSection(this);
  if ((j < 0 || !bVar3) ||
     ((int)((ulong)((long)(this->DynamicSectionEntries).
                          super__Vector_base<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(this->DynamicSectionEntries).
                         super__Vector_base<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 4) <= j)) {
    uVar4 = 0;
  }
  else {
    iVar1 = (this->super_cmELFInternal).DynamicSectionIndex;
    paVar2 = (this->SectionHeaders).super__Vector_base<Elf64_Shdr,_std::allocator<Elf64_Shdr>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar4 = (ulong)(uint)j * paVar2[iVar1].sh_entsize + paVar2[iVar1].sh_offset;
  }
  return uVar4;
}

Assistant:

unsigned long cmELFInternalImpl<Types>::GetDynamicEntryPosition(int j)
{
  if (!this->LoadDynamicSection()) {
    return 0;
  }
  if (j < 0 || j >= static_cast<int>(this->DynamicSectionEntries.size())) {
    return 0;
  }
  ELF_Shdr const& sec = this->SectionHeaders[this->DynamicSectionIndex];
  return static_cast<unsigned long>(sec.sh_offset + sec.sh_entsize * j);
}